

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void check_overlap_4(uint32_t d,uint32_t a,uint32_t b,uint32_t c,uint32_t s)

{
  uint32_t s_local;
  uint32_t c_local;
  uint32_t b_local;
  uint32_t a_local;
  uint32_t d_local;
  
  check_overlap_2(d,a,s);
  check_overlap_2(d,b,s);
  check_overlap_2(d,c,s);
  check_overlap_2(a,b,s);
  check_overlap_2(a,c,s);
  check_overlap_2(b,c,s);
  return;
}

Assistant:

static void check_overlap_4(uint32_t d, uint32_t a, uint32_t b,
                            uint32_t c, uint32_t s)
{
    check_overlap_2(d, a, s);
    check_overlap_2(d, b, s);
    check_overlap_2(d, c, s);
    check_overlap_2(a, b, s);
    check_overlap_2(a, c, s);
    check_overlap_2(b, c, s);
}